

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subcommand.c
# Opt level: O3

REF_STATUS
moving_fixed_point_metric
          (REF_DBL *metric,REF_GRID_conflict ref_grid,REF_INT first_timestep,REF_INT last_timestep,
          REF_INT timestep_increment,char *in_project,char *solb_middle,
          REF_RECON_RECONSTRUCTION reconstruction,REF_INT p,REF_DBL gradation,REF_DBL complexity)

{
  undefined8 *puVar1;
  double *pdVar2;
  undefined8 *puVar3;
  int iVar4;
  REF_NODE ref_node;
  REF_DBL *pRVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  REF_GRID_conflict ref_grid_00;
  REF_MPI ref_mpi;
  REF_INT RVar8;
  uint uVar9;
  REF_DBL *pRVar10;
  void *pvVar11;
  REF_DBL *pRVar12;
  void *pvVar13;
  ulong uVar14;
  int iVar15;
  REF_GLOB *pRVar16;
  long lVar17;
  undefined8 uVar18;
  REF_DBL *pRVar19;
  REF_DBL *pRVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  char *pcVar25;
  void *pvVar26;
  REF_STATUS RVar27;
  size_t __size;
  double dVar28;
  REF_INT fixed_point_ldim;
  REF_DBL *scalar;
  REF_DBL *displaced;
  REF_DBL det;
  char solb_filename [1024];
  int local_4d4;
  void *local_4d0;
  REF_DBL *local_4c8;
  void *local_4c0;
  REF_GRID_conflict local_4b8;
  REF_DBL *local_4b0;
  REF_DBL *local_4a8;
  int local_49c;
  REF_INT local_498;
  REF_INT local_494;
  REF_DBL *local_490;
  REF_MPI local_488;
  REF_DBL *local_480;
  long local_478;
  REF_DBL *local_470;
  REF_DBL *local_468;
  REF_DBL local_460;
  REF_DBL local_458;
  char *local_450;
  double local_448;
  double local_440;
  char local_438 [1032];
  
  ref_node = ref_grid->node;
  uVar9 = ref_node->max;
  uVar14 = (ulong)uVar9;
  if ((int)uVar9 < 0) {
    pcVar25 = "malloc hess of REF_DBL negative";
    uVar18 = 0xb2f;
LAB_00123f1a:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           uVar18,"moving_fixed_point_metric",pcVar25);
LAB_00123f21:
    RVar27 = 1;
  }
  else {
    local_488 = ref_grid->mpi;
    local_494 = timestep_increment;
    local_460 = gradation;
    local_458 = complexity;
    local_450 = in_project;
    pRVar10 = (REF_DBL *)malloc(uVar14 * 0x30);
    if (pRVar10 == (REF_DBL *)0x0) {
      pcVar25 = "malloc hess of REF_DBL NULL";
      uVar18 = 0xb2f;
    }
    else {
      pvVar11 = malloc(uVar14 * 0x30);
      if (pvVar11 == (void *)0x0) {
        pcVar25 = "malloc this_metric of REF_DBL NULL";
        uVar18 = 0xb30;
      }
      else {
        local_4c0 = pvVar11;
        local_4b0 = pRVar10;
        pvVar11 = malloc(uVar14 * 0x48);
        if (pvVar11 == (void *)0x0) {
          pcVar25 = "malloc jac of REF_DBL NULL";
          uVar18 = 0xb31;
        }
        else {
          local_490 = metric;
          pRVar10 = (REF_DBL *)malloc(uVar14 * 8);
          if (pRVar10 == (REF_DBL *)0x0) {
            pcVar25 = "malloc x of REF_DBL NULL";
            uVar18 = 0xb32;
          }
          else {
            __size = (ulong)(uVar9 * 3) << 3;
            pRVar12 = (REF_DBL *)malloc(__size);
            if (pRVar12 == (REF_DBL *)0x0) {
              pcVar25 = "malloc grad of REF_DBL NULL";
              uVar18 = 0xb33;
            }
            else {
              pvVar13 = malloc(__size);
              if (pvVar13 != (void *)0x0) {
                iVar15 = 0;
                local_4d0 = pvVar13;
                if (first_timestep <= last_timestep) {
                  local_468 = pRVar12 + 2;
                  local_448 = 1.0 / (double)(int)reconstruction;
                  iVar15 = 0;
                  local_4b8 = ref_grid;
                  RVar8 = first_timestep;
                  do {
                    local_498 = RVar8;
                    local_49c = iVar15;
                    snprintf(local_438,0x400,"%s%s%d.solb",local_450);
                    if (local_488->id == 0) {
                      printf("read and hess recon for %s\n",local_438);
                    }
                    uVar9 = ref_part_scalar(ref_grid,&local_4d4,&local_4a8,local_438);
                    if (uVar9 != 0) {
                      pcVar25 = "unable to load scalar";
                      uVar18 = 0xb3e;
                      goto LAB_0012452a;
                    }
                    if ((long)local_4d4 != 4) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                             ,0xb3f,"moving_fixed_point_metric","expected x,y,z and one scalar",4,
                             (long)local_4d4);
                      goto LAB_00123f21;
                    }
                    uVar9 = extract_displaced_xyz(ref_node,&local_4d4,&local_4a8,&local_480);
                    ref_grid_00 = local_4b8;
                    if (uVar9 != 0) {
                      pcVar25 = "disp";
                      uVar18 = 0xb41;
                      goto LAB_0012452a;
                    }
                    if (local_4b8->twod == 0) {
                      uVar14 = (ulong)(uint)ref_node->max;
                    }
                    else {
                      uVar14 = (ulong)ref_node->max;
                      if (0 < (long)uVar14) {
                        pRVar16 = ref_node->global;
                        lVar17 = 0;
                        do {
                          if (-1 < *pRVar16) {
                            *(undefined8 *)((long)local_480 + lVar17 + 8) =
                                 *(undefined8 *)((long)local_480 + lVar17 + 0x10);
                            *(undefined8 *)((long)local_480 + lVar17 + 0x10) = 0;
                          }
                          pRVar16 = pRVar16 + 1;
                          lVar17 = lVar17 + 0x18;
                        } while (uVar14 * 0x18 != lVar17);
                      }
                    }
                    local_4c8 = local_480;
                    lVar17 = 0;
                    do {
                      while( true ) {
                        if (0 < (int)uVar14) {
                          pRVar16 = ref_node->global;
                          pRVar19 = local_4c8 + lVar17;
                          uVar21 = 0;
                          do {
                            if (-1 < pRVar16[uVar21]) {
                              pRVar10[uVar21] = *pRVar19;
                            }
                            uVar21 = uVar21 + 1;
                            pRVar19 = pRVar19 + 3;
                          } while ((uVar14 & 0xffffffff) != uVar21);
                        }
                        uVar9 = ref_recon_gradient(ref_grid_00,pRVar10,pRVar12,
                                                   REF_RECON_L2PROJECTION);
                        pRVar19 = local_4b0;
                        if (uVar9 != 0) {
                          pcVar25 = "recon x";
                          uVar18 = 0xb4c;
                          goto LAB_0012452a;
                        }
                        uVar9 = ref_node->max;
                        uVar14 = (ulong)uVar9;
                        if (ref_grid_00->twod == 0) break;
                        if (0 < (int)uVar9) {
                          pRVar16 = ref_node->global;
                          uVar21 = 0;
                          pRVar20 = local_468;
                          do {
                            if (-1 < pRVar16[uVar21]) {
                              *pRVar20 = 1.0;
                            }
                            uVar21 = uVar21 + 1;
                            pRVar20 = pRVar20 + 3;
                          } while (uVar14 != uVar21);
                          break;
                        }
LAB_00124276:
                        lVar17 = lVar17 + 1;
                        if (lVar17 == 3) goto LAB_001242e2;
                      }
                      if ((int)uVar9 < 1) goto LAB_00124276;
                      pRVar16 = ref_node->global;
                      uVar21 = lVar17 * 0x18;
                      uVar23 = 0;
                      do {
                        if (-1 < *pRVar16) {
                          *(undefined8 *)((long)pvVar11 + (uVar21 & 0x7fffffff8) + 0x10) =
                               *(undefined8 *)((long)pRVar12 + (uVar23 & 0x7fffffff8) + 0x10);
                          puVar1 = (undefined8 *)((long)pRVar12 + (uVar23 & 0x7fffffff8));
                          uVar18 = puVar1[1];
                          puVar3 = (undefined8 *)((long)pvVar11 + (uVar21 & 0x7fffffff8));
                          *puVar3 = *puVar1;
                          puVar3[1] = uVar18;
                        }
                        uVar23 = uVar23 + 0x18;
                        uVar21 = uVar21 + 0x48;
                        pRVar16 = pRVar16 + 1;
                      } while (uVar14 * 0x18 != uVar23);
                      lVar17 = lVar17 + 1;
                    } while (lVar17 != 3);
                    if (0 < (int)uVar9) {
                      pRVar16 = ref_node->global;
                      lVar17 = 0;
                      uVar21 = 0;
                      pvVar13 = local_4d0;
                      pRVar20 = local_4c8;
                      do {
                        if (-1 < pRVar16[uVar21]) {
                          pRVar5 = ref_node->real;
                          lVar22 = 0;
                          do {
                            *(undefined8 *)((long)pvVar13 + lVar22 * 8) =
                                 *(undefined8 *)((long)pRVar5 + lVar22 * 8 + lVar17);
                            *(REF_DBL *)((long)pRVar5 + lVar22 * 8 + lVar17) = pRVar20[lVar22];
                            lVar22 = lVar22 + 1;
                          } while (lVar22 != 3);
                        }
                        uVar21 = uVar21 + 1;
                        lVar17 = lVar17 + 0x78;
                        pRVar20 = pRVar20 + 3;
                        pvVar13 = (void *)((long)pvVar13 + 0x18);
                      } while (uVar21 != uVar14);
                    }
LAB_001242e2:
                    uVar9 = ref_recon_hessian(ref_grid_00,local_4a8,local_4b0,REF_RECON_L2PROJECTION
                                             );
                    if (uVar9 != 0) {
                      pcVar25 = "hess";
                      uVar18 = 0xb5d;
                      goto LAB_0012452a;
                    }
                    uVar9 = ref_recon_roundoff_limit(pRVar19,ref_grid_00);
                    if (uVar9 != 0) {
                      pcVar25 = "floor metric eigenvalues based on grid size and solution jitter";
                      uVar18 = 0xb5f;
                      goto LAB_0012452a;
                    }
                    iVar15 = ref_node->max;
                    uVar14 = (ulong)iVar15;
                    ref_grid = local_4b8;
                    if (0 < (long)uVar14) {
                      pRVar16 = ref_node->global;
                      uVar21 = 0;
                      do {
                        if (-1 < pRVar16[uVar21]) {
                          uVar23 = uVar21 * 0x18 & 0x7fffffff8;
                          uVar24 = uVar21 * 0x78 & 0x7fffffff8;
                          pRVar19 = ref_node->real;
                          *(undefined8 *)((long)pRVar19 + uVar24 + 0x10) =
                               *(undefined8 *)((long)local_4d0 + uVar23 + 0x10);
                          puVar1 = (undefined8 *)((long)local_4d0 + uVar23);
                          uVar18 = puVar1[1];
                          puVar3 = (undefined8 *)((long)pRVar19 + uVar24);
                          *puVar3 = *puVar1;
                          puVar3[1] = uVar18;
                        }
                        uVar21 = uVar21 + 1;
                      } while (uVar21 != uVar14);
                      if (0 < iVar15) {
                        lVar17 = 0;
                        pvVar13 = local_4c0;
                        pvVar26 = local_4c0;
                        do {
                          if (-1 < ref_node->global[lVar17]) {
                            local_470 = (REF_DBL *)(lVar17 * 0x48 + (long)pvVar11);
                            local_478 = lVar17;
                            uVar9 = ref_matrix_jac_m_jact
                                              (local_470,local_4b0 + lVar17 * 6,
                                               (REF_DBL *)(lVar17 * 0x30 + (long)pvVar13));
                            if (uVar9 != 0) {
                              pcVar25 = "J M J^t";
                              uVar18 = 0xb69;
                              goto LAB_0012452a;
                            }
                            uVar9 = ref_matrix_det_gen(3,local_470,&local_440);
                            if (uVar9 != 0) {
                              pcVar25 = "gen det";
                              uVar18 = 0xb6b;
                              goto LAB_0012452a;
                            }
                            lVar17 = 0;
                            do {
                              dVar28 = local_440;
                              if (local_440 <= -local_440) {
                                dVar28 = -local_440;
                              }
                              dVar28 = pow(dVar28,local_448);
                              *(double *)((long)pvVar26 + lVar17 * 8) =
                                   dVar28 * *(double *)((long)pvVar26 + lVar17 * 8);
                              lVar17 = lVar17 + 1;
                            } while (lVar17 != 6);
                            uVar14 = (ulong)(uint)ref_node->max;
                            lVar17 = local_478;
                            pvVar13 = local_4c0;
                            ref_grid = local_4b8;
                          }
                          lVar17 = lVar17 + 1;
                          pvVar26 = (void *)((long)pvVar26 + 0x30);
                        } while (lVar17 < (int)uVar14);
                        if (0 < (int)uVar14) {
                          pRVar16 = ref_node->global;
                          uVar21 = 0;
                          pvVar13 = local_4c0;
                          pRVar19 = local_490;
                          do {
                            if (-1 < pRVar16[uVar21]) {
                              lVar17 = 0;
                              do {
                                pdVar2 = (double *)((long)pvVar13 + lVar17 * 8);
                                dVar28 = (pRVar19 + lVar17)[1] + pdVar2[1];
                                auVar7._8_4_ = SUB84(dVar28,0);
                                auVar7._0_8_ = pRVar19[lVar17] + *pdVar2;
                                auVar7._12_4_ = (int)((ulong)dVar28 >> 0x20);
                                *(undefined1 (*) [16])(pRVar19 + lVar17) = auVar7;
                                lVar17 = lVar17 + 2;
                              } while (lVar17 != 6);
                            }
                            uVar21 = uVar21 + 1;
                            pRVar19 = pRVar19 + 6;
                            pvVar13 = (void *)((long)pvVar13 + 0x30);
                          } while (uVar21 != (uVar14 & 0xffffffff));
                        }
                      }
                    }
                    pvVar13 = local_4d0;
                    if (local_4c8 != (REF_DBL *)0x0) {
                      free(local_4c8);
                    }
                    if (local_4a8 != (REF_DBL *)0x0) {
                      free(local_4a8);
                    }
                    iVar15 = local_49c + 1;
                    RVar8 = local_498 + local_494;
                  } while (local_498 + local_494 <= last_timestep);
                }
                free(pvVar13);
                free(pRVar12);
                free(pRVar10);
                free(pvVar11);
                free(local_4c0);
                free(local_4b0);
                ref_mpi = local_488;
                ref_mpi_stopwatch_stop(local_488,"all timesteps processed");
                pRVar10 = local_490;
                if (iVar15 != 0) {
                  iVar4 = ref_node->max;
                  if (0 < (long)iVar4) {
                    pRVar16 = ref_node->global;
                    lVar17 = 0;
                    pRVar12 = local_490;
                    do {
                      if (-1 < pRVar16[lVar17]) {
                        lVar22 = 0;
                        do {
                          dVar28 = (pRVar12 + lVar22)[1] * (1.0 / (double)iVar15);
                          auVar6._8_4_ = SUB84(dVar28,0);
                          auVar6._0_8_ = pRVar12[lVar22] * (1.0 / (double)iVar15);
                          auVar6._12_4_ = (int)((ulong)dVar28 >> 0x20);
                          *(undefined1 (*) [16])(pRVar12 + lVar22) = auVar6;
                          lVar22 = lVar22 + 2;
                        } while (lVar22 != 6);
                      }
                      lVar17 = lVar17 + 1;
                      pRVar12 = pRVar12 + 6;
                    } while (lVar17 != iVar4);
                  }
                  uVar9 = ref_recon_roundoff_limit(local_490,ref_grid);
                  if (uVar9 == 0) {
                    uVar9 = ref_metric_local_scale(pRVar10,ref_grid,reconstruction);
                    if (uVar9 == 0) {
                      ref_mpi_stopwatch_stop(ref_mpi,"local scale metric");
                      uVar9 = ref_metric_gradation_at_complexity
                                        (pRVar10,ref_grid,local_460,local_458);
                      if (uVar9 == 0) {
                        ref_mpi_stopwatch_stop(ref_mpi,"metric gradation and complexity");
                        return 0;
                      }
                      pcVar25 = "gradation at complexity";
                      uVar18 = 0xb90;
                    }
                    else {
                      pcVar25 = "local lp norm scaling";
                      uVar18 = 0xb8c;
                    }
                  }
                  else {
                    pcVar25 = "floor metric eigenvalues based on grid size and solution jitter";
                    uVar18 = 0xb8b;
                  }
LAB_0012452a:
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                         ,uVar18,"moving_fixed_point_metric",(ulong)uVar9,pcVar25);
                  return uVar9;
                }
                pcVar25 = "expected one or more timesteps";
                uVar18 = 0xb83;
                goto LAB_00123f1a;
              }
              pcVar25 = "malloc xyz of REF_DBL NULL";
              uVar18 = 0xb34;
              local_4d0 = (void *)0x0;
            }
          }
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           uVar18,"moving_fixed_point_metric",pcVar25);
    RVar27 = 2;
  }
  return RVar27;
}

Assistant:

static REF_STATUS moving_fixed_point_metric(
    REF_DBL *metric, REF_GRID ref_grid, REF_INT first_timestep,
    REF_INT last_timestep, REF_INT timestep_increment, const char *in_project,
    const char *solb_middle, REF_RECON_RECONSTRUCTION reconstruction, REF_INT p,
    REF_DBL gradation, REF_DBL complexity) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL *hess, *scalar;
  REF_DBL *jac, *x, *grad, *this_metric, *xyz, det;
  REF_INT timestep, total_timesteps;
  char solb_filename[1024];
  REF_DBL inv_total;
  REF_INT im, node;
  REF_INT fixed_point_ldim;
  REF_DBL *displaced;
  REF_INT i, j;

  ref_malloc(hess, 6 * ref_node_max(ref_node), REF_DBL);
  ref_malloc(this_metric, 6 * ref_node_max(ref_node), REF_DBL);
  ref_malloc(jac, 9 * ref_node_max(ref_node), REF_DBL);
  ref_malloc(x, ref_node_max(ref_node), REF_DBL);
  ref_malloc(grad, 3 * ref_node_max(ref_node), REF_DBL);
  ref_malloc(xyz, 3 * ref_node_max(ref_node), REF_DBL);

  total_timesteps = 0;
  for (timestep = first_timestep; timestep <= last_timestep;
       timestep += timestep_increment) {
    snprintf(solb_filename, 1024, "%s%s%d.solb", in_project, solb_middle,
             timestep);
    if (ref_mpi_once(ref_mpi))
      printf("read and hess recon for %s\n", solb_filename);
    RSS(ref_part_scalar(ref_grid, &fixed_point_ldim, &scalar, solb_filename),
        "unable to load scalar");
    REIS(4, fixed_point_ldim, "expected x,y,z and one scalar");
    RSS(extract_displaced_xyz(ref_node, &fixed_point_ldim, &scalar, &displaced),
        "disp");
    if (ref_grid_twod(ref_grid)) {
      each_ref_node_valid_node(ref_node, node) {
        displaced[1 + 3 * node] = displaced[2 + 3 * node];
        displaced[2 + 3 * node] = 0.0;
      }
    }
    for (j = 0; j < 3; j++) {
      each_ref_node_valid_node(ref_node, node) {
        x[node] = displaced[j + 3 * node];
      }
      RSS(ref_recon_gradient(ref_grid, x, grad, reconstruction), "recon x");
      if (ref_grid_twod(ref_grid)) {
        each_ref_node_valid_node(ref_node, node) { grad[2 + 3 * node] = 1.0; }
      }
      each_ref_node_valid_node(ref_node, node) {
        for (i = 0; i < 3; i++) {
          jac[i + 3 * j + 9 * node] = grad[i + 3 * node];
        }
      }
    }

    each_ref_node_valid_node(ref_node, node) {
      for (i = 0; i < 3; i++) {
        xyz[i + 3 * node] = ref_node_xyz(ref_node, i, node);
        ref_node_xyz(ref_node, i, node) = displaced[i + 3 * node];
      }
    }
    RSS(ref_recon_hessian(ref_grid, scalar, hess, reconstruction), "hess");
    RSS(ref_recon_roundoff_limit(hess, ref_grid),
        "floor metric eigenvalues based on grid size and solution jitter");
    each_ref_node_valid_node(ref_node, node) {
      for (i = 0; i < 3; i++) {
        ref_node_xyz(ref_node, i, node) = xyz[i + 3 * node];
      }
    }

    each_ref_node_valid_node(ref_node, node) {
      RSS(ref_matrix_jac_m_jact(&(jac[9 * node]), &(hess[6 * node]),
                                &(this_metric[6 * node])),
          "J M J^t");

      RSS(ref_matrix_det_gen(3, &(jac[9 * node]), &det), "gen det");
      for (i = 0; i < 6; i++) {
        this_metric[i + 6 * node] *= pow(ABS(det), 1.0 / (REF_DBL)p);
      }
    }

    total_timesteps++;
    each_ref_node_valid_node(ref_node, node) {
      for (im = 0; im < 6; im++) {
        metric[im + 6 * node] += this_metric[im + 6 * node];
      }
    }

    ref_free(displaced);
    ref_free(scalar);
  }
  free(xyz);
  free(grad);
  free(x);
  free(jac);
  free(this_metric);
  free(hess);
  ref_mpi_stopwatch_stop(ref_mpi, "all timesteps processed");

  RAS(0 < total_timesteps, "expected one or more timesteps");
  inv_total = 1.0 / (REF_DBL)total_timesteps;
  each_ref_node_valid_node(ref_node, node) {
    for (im = 0; im < 6; im++) {
      metric[im + 6 * node] *= inv_total;
    }
  }
  RSS(ref_recon_roundoff_limit(metric, ref_grid),
      "floor metric eigenvalues based on grid size and solution jitter");
  RSS(ref_metric_local_scale(metric, ref_grid, p), "local lp norm scaling");
  ref_mpi_stopwatch_stop(ref_mpi, "local scale metric");
  RSS(ref_metric_gradation_at_complexity(metric, ref_grid, gradation,
                                         complexity),
      "gradation at complexity");
  ref_mpi_stopwatch_stop(ref_mpi, "metric gradation and complexity");
  return REF_SUCCESS;
}